

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O3

int brynet::net::HTTPParser::sHeadComplete(http_parser *hp)

{
  void *pvVar1;
  int iVar2;
  mapped_type *pmVar3;
  int iVar4;
  long lVar5;
  http_parser_url u;
  http_parser_url local_60;
  long *local_40 [2];
  long local_30 [2];
  
  pvVar1 = hp->data;
  if (*(long *)((long)pvVar1 + 0x88) != 0) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)((long)pvVar1 + 0x120),(key_type *)((long)pvVar1 + 0x80));
    std::__cxx11::string::_M_assign((string *)pmVar3);
  }
  if (*(size_t *)((long)pvVar1 + 0x160) == 0) {
    iVar4 = 0;
  }
  else {
    iVar2 = http_parser_parse_url
                      (*(char **)((long)pvVar1 + 0x158),*(size_t *)((long)pvVar1 + 0x160),0,
                       &local_60);
    iVar4 = -1;
    if (iVar2 == 0) {
      if (((byte)local_60.field_set & 8) == 0) {
        sHeadComplete((HTTPParser *)((long)pvVar1 + 0x158));
      }
      else {
        lVar5 = (ulong)local_60.field_data[3].off + *(long *)((long)pvVar1 + 0x158);
        local_40[0] = local_30;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_40,lVar5,(ulong)local_60.field_data[3].len + lVar5);
        std::__cxx11::string::operator=((string *)((long)pvVar1 + 0xc0),(string *)local_40);
        if (local_40[0] != local_30) {
          operator_delete(local_40[0],local_30[0] + 1);
        }
        iVar4 = 0;
        if (((byte)local_60.field_set & 0x10) != 0) {
          lVar5 = (ulong)local_60.field_data[4].off + *(long *)((long)pvVar1 + 0x158);
          local_40[0] = local_30;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_40,lVar5,(ulong)local_60.field_data[4].len + lVar5);
          std::__cxx11::string::operator=((string *)((long)pvVar1 + 0xe0),(string *)local_40);
          iVar4 = 0;
          if (local_40[0] != local_30) {
            operator_delete(local_40[0],local_30[0] + 1);
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int HTTPParser::sHeadComplete(http_parser* hp)
{
    HTTPParser* httpParser = (HTTPParser*)hp->data;
    if (!httpParser->mCurrentField.empty())
    {
        httpParser->mHeadValues[httpParser->mCurrentField] = httpParser->mCurrentValue;
    }

    if (httpParser->mUrl.empty())
    {
        return 0;
    }

    struct http_parser_url u;

    int result = http_parser_parse_url(httpParser->mUrl.data(), httpParser->mUrl.size(), 0, &u);
    if (result != 0)
    {
        return -1;
    }

    if (!(u.field_set & (1 << UF_PATH)))
    {
        fprintf(stderr, "\n\n*** failed to parse PATH in URL %s ***\n\n", httpParser->mUrl.c_str());
        return -1;
    }

    httpParser->mPath = std::string(httpParser->mUrl.data() + u.field_data[UF_PATH].off, u.field_data[UF_PATH].len);
    if ((u.field_set & (1 << UF_QUERY)))
    {
        httpParser->mQuery = std::string(httpParser->mUrl.data() + u.field_data[UF_QUERY].off, u.field_data[UF_QUERY].len);
    }

    return 0;
}